

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::addInputArgumentConversions
          (HlslParseContext *this,TFunction *function,TIntermTyped **arguments)

{
  EShLanguage s;
  TType *pTVar1;
  TIntermediate *pTVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar8;
  TIntermTyped *pTVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TVariable *pTVar10;
  undefined4 extraout_var_07;
  TQualifier *this_00;
  TPoolAllocator *this_01;
  TIntermSymbol *this_02;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  TIntermTyped *pTVar11;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  TIntermAggregate *pTVar12;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  ulong uVar13;
  long *plVar7;
  undefined4 extraout_var_01;
  
  iVar4 = (*((*arguments)->super_TIntermNode)._vptr_TIntermNode[6])();
  plVar7 = (long *)CONCAT44(extraout_var,iVar4);
  iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
  if (0 < iVar4) {
    uVar13 = 0;
    do {
      iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar13 & 0xffffffff);
      lVar8 = (**(code **)(**(long **)(CONCAT44(extraout_var_00,iVar4) + 8) + 0x50))();
      if (((*(uint *)(lVar8 + 8) & 0x7f) < 0x14) &&
         ((0xd0000U >> (*(uint *)(lVar8 + 8) & 0x1f) & 1) != 0)) {
        iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
        if ((iVar4 == 1) || (plVar7 == (long *)0x0)) {
          pTVar9 = *arguments;
        }
        else {
          lVar8 = (**(code **)(*plVar7 + 400))();
          pTVar9 = *(TIntermTyped **)(*(long *)(lVar8 + 8) + uVar13 * 8);
        }
        iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[3])();
        pTVar9 = (TIntermTyped *)CONCAT44(extraout_var_01,iVar4);
        iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar13 & 0xffffffff);
        pTVar1 = *(TType **)(CONCAT44(extraout_var_02,iVar4) + 8);
        iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
        bVar3 = TType::operator==(pTVar1,(TType *)CONCAT44(extraout_var_03,iVar4));
        if (bVar3) {
          bVar3 = wasFlattened(this,pTVar9);
          if (bVar3) {
            iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar13 & 0xffffffff);
            pTVar1 = *(TType **)(CONCAT44(extraout_var_04,iVar4) + 8);
            iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar13 & 0xffffffff);
            lVar8 = (**(code **)(**(long **)(CONCAT44(extraout_var_05,iVar4) + 8) + 0x50))();
            bVar3 = shouldFlatten(this,pTVar1,*(TStorageQualifier *)(lVar8 + 8) & 0x7f,true);
            if (!bVar3) {
              iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar13 & 0xffffffff)
              ;
              pTVar10 = makeInternalVariable
                                  (this,"aggShadow",*(TType **)(CONCAT44(extraout_var_06,iVar4) + 8)
                                  );
              iVar4 = (*(pTVar10->super_TSymbol)._vptr_TSymbol[0xd])(pTVar10);
              this_00 = (TQualifier *)
                        (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar4) + 0x50))
                                  ((long *)CONCAT44(extraout_var_07,iVar4));
              this_00->semanticName = (char *)0x0;
              *(ulong *)&this_00->field_0x8 = *(ulong *)&this_00->field_0x8 & 0xf80000141fff0000;
              TQualifier::clearLayout(this_00);
              this_00->spirvStorageClass = -1;
              this_00->spirvDecorate = (TSpirvDecorate *)0x0;
              this_00->field_0xf = this_00->field_0xf & 0xe7;
              this_01 = GetThreadPoolAllocator();
              this_02 = (TIntermSymbol *)TPoolAllocator::allocate(this_01,0x138);
              iVar4 = (*(pTVar10->super_TSymbol)._vptr_TSymbol[0xf])(pTVar10);
              iVar5 = (*(pTVar10->super_TSymbol)._vptr_TSymbol[3])(pTVar10);
              s = (this->super_TParseContextBase).super_TParseVersions.language;
              iVar6 = (*(pTVar10->super_TSymbol)._vptr_TSymbol[0xc])(pTVar10);
              TIntermSymbol::TIntermSymbol
                        (this_02,CONCAT44(extraout_var_08,iVar4),
                         (TString *)CONCAT44(extraout_var_09,iVar5),s,
                         (TType *)CONCAT44(extraout_var_10,iVar6),(TString *)0x0);
              iVar4 = (**(pTVar9->super_TIntermNode)._vptr_TIntermNode)(pTVar9);
              (*(this_02->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[1])
                        (this_02,CONCAT44(extraout_var_11,iVar4));
              iVar4 = (**(pTVar9->super_TIntermNode)._vptr_TIntermNode)(pTVar9);
              pTVar11 = handleAssign(this,(TSourceLoc *)CONCAT44(extraout_var_12,iVar4),EOpAssign,
                                     (TIntermTyped *)this_02,pTVar9);
              iVar4 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[6])(pTVar11);
              pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
              iVar5 = (**(pTVar9->super_TIntermNode)._vptr_TIntermNode)(pTVar9);
              pTVar12 = TIntermediate::growAggregate
                                  (pTVar2,(TIntermNode *)CONCAT44(extraout_var_13,iVar4),
                                   (TIntermNode *)this_02,
                                   (TSourceLoc *)CONCAT44(extraout_var_14,iVar5));
              (*(pTVar12->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x31])(pTVar12,0x2b);
              iVar4 = (*(pTVar10->super_TSymbol)._vptr_TSymbol[0xc])(pTVar10);
              (*(pTVar12->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x1d])(pTVar12,CONCAT44(extraout_var_15,iVar4));
              iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
              if ((iVar4 == 1) || (plVar7 == (long *)0x0)) {
                *arguments = (TIntermTyped *)pTVar12;
              }
              else {
                lVar8 = (**(code **)(*plVar7 + 400))();
                *(TIntermAggregate **)(*(long *)(lVar8 + 8) + uVar13 * 8) = pTVar12;
              }
            }
          }
        }
        else {
          pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar13 & 0xffffffff);
          pTVar11 = TIntermediate::addConversion
                              (pTVar2,EOpFunctionCall,
                               *(TType **)(CONCAT44(extraout_var_16,iVar4) + 8),pTVar9);
          if (pTVar11 == (TIntermTyped *)0x0) {
            pTVar11 = (TIntermTyped *)0x0;
          }
          else {
            pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar13 & 0xffffffff);
            pTVar11 = TIntermediate::addUniShapeConversion
                                (pTVar2,EOpFunctionCall,
                                 *(TType **)(CONCAT44(extraout_var_17,iVar4) + 8),pTVar11);
          }
          if (pTVar11 == (TIntermTyped *)0x0) {
            iVar4 = (**(pTVar9->super_TIntermNode)._vptr_TIntermNode)(pTVar9);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,CONCAT44(extraout_var_18,iVar4),
                       "cannot convert input argument, argument","","%d");
          }
          else {
            iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
            if ((iVar4 == 1) || (plVar7 == (long *)0x0)) {
              *arguments = pTVar11;
            }
            else {
              lVar8 = (**(code **)(*plVar7 + 400))();
              *(TIntermTyped **)(*(long *)(lVar8 + 8) + uVar13 * 8) = pTVar11;
            }
          }
        }
      }
      uVar13 = uVar13 + 1;
      iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    } while ((long)uVar13 < (long)iVar4);
  }
  return;
}

Assistant:

void HlslParseContext::addInputArgumentConversions(const TFunction& function, TIntermTyped*& arguments)
{
    TIntermAggregate* aggregate = arguments->getAsAggregate();

    // Replace a single argument with a single argument.
    const auto setArg = [&](int paramNum, TIntermTyped* arg) {
        if (function.getParamCount() == 1)
            arguments = arg;
        else {
            if (aggregate == nullptr)
                arguments = arg;
            else
                aggregate->getSequence()[paramNum] = arg;
        }
    };

    // Process each argument's conversion
    for (int param = 0; param < function.getParamCount(); ++param) {
        if (! function[param].type->getQualifier().isParamInput())
            continue;

        // At this early point there is a slight ambiguity between whether an aggregate 'arguments'
        // is the single argument itself or its children are the arguments.  Only one argument
        // means take 'arguments' itself as the one argument.
        TIntermTyped* arg = function.getParamCount() == 1
                                   ? arguments->getAsTyped()
                                   : (aggregate ?
                                        aggregate->getSequence()[param]->getAsTyped() :
                                        arguments->getAsTyped());
        if (*function[param].type != arg->getType()) {
            // In-qualified arguments just need an extra node added above the argument to
            // convert to the correct type.
            TIntermTyped* convArg = intermediate.addConversion(EOpFunctionCall, *function[param].type, arg);
            if (convArg != nullptr)
                convArg = intermediate.addUniShapeConversion(EOpFunctionCall, *function[param].type, convArg);
            if (convArg != nullptr)
                setArg(param, convArg);
            else
                error(arg->getLoc(), "cannot convert input argument, argument", "", "%d", param);
        } else {
            if (wasFlattened(arg)) {
                // If both formal and calling arg are to be flattened, leave that to argument
                // expansion, not conversion.
                if (!shouldFlatten(*function[param].type, function[param].type->getQualifier().storage, true)) {
                    // Will make a two-level subtree.
                    // The deepest will copy member-by-member to build the structure to pass.
                    // The level above that will be a two-operand EOpComma sequence that follows the copy by the
                    // object itself.
                    TVariable* internalAggregate = makeInternalVariable("aggShadow", *function[param].type);
                    internalAggregate->getWritableType().getQualifier().makeTemporary();
                    TIntermSymbol* internalSymbolNode = new TIntermSymbol(internalAggregate->getUniqueId(),
                                                                          internalAggregate->getName(),
                                                                          getLanguage(),
                                                                          internalAggregate->getType());
                    internalSymbolNode->setLoc(arg->getLoc());
                    // This makes the deepest level, the member-wise copy
                    TIntermAggregate* assignAgg = handleAssign(arg->getLoc(), EOpAssign,
                                                               internalSymbolNode, arg)->getAsAggregate();

                    // Now, pair that with the resulting aggregate.
                    assignAgg = intermediate.growAggregate(assignAgg, internalSymbolNode, arg->getLoc());
                    assignAgg->setOperator(EOpComma);
                    assignAgg->setType(internalAggregate->getType());
                    setArg(param, assignAgg);
                }
            }
        }
    }
}